

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SingleFileErrorCollector::
~SingleFileErrorCollector(SingleFileErrorCollector *this)

{
  ~SingleFileErrorCollector(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~SingleFileErrorCollector() override {}